

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.cpp
# Opt level: O3

void __thiscall front::symbolTable::SymbolTable::SymbolTable(SymbolTable *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  element_type *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  (this->symbol_stack).
  super__Vector_base<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->symbol_stack).
  super__Vector_base<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->symbol_stack).
  super__Vector_base<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->symbol_map)._M_h._M_buckets = &(this->symbol_map)._M_h._M_single_bucket;
  (this->symbol_map)._M_h._M_bucket_count = 1;
  (this->symbol_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->symbol_map)._M_h._M_element_count = 0;
  (this->symbol_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->symbol_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->symbol_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->holder_symbol).super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->holder_symbol).super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_01 = (element_type *)operator_new(0x30);
  symbol::VoidSymbol::VoidSymbol((VoidSymbol *)this_01);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<front::symbol::VoidSymbol*>
            (&_Stack_20,(VoidSymbol *)this_01);
  _Var1._M_pi = _Stack_20._M_pi;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->holder_symbol).
            super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->holder_symbol).super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = this_01;
  (this->holder_symbol).super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
    }
  }
  return;
}

Assistant:

SymbolTable::SymbolTable() {
  holder_symbol = SharedSyPtr(new symbol::VoidSymbol());
}